

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O2

void Int_ManResize(Int_Man_t *p)

{
  int iVar1;
  int iVar2;
  lit *plVar3;
  char *pcVar4;
  int *piVar5;
  Sto_Cls_t **ppSVar6;
  uint *puVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  
  iVar8 = p->nVarsAlloc;
  iVar2 = p->pCnf->nVars;
  if (iVar8 < iVar2) {
    if (iVar8 != 0) goto LAB_0045f52c;
    iVar8 = 1;
    while( true ) {
      p->nVarsAlloc = iVar8;
LAB_0045f52c:
      if (iVar2 <= iVar8) break;
      iVar8 = iVar8 * 2;
    }
    if (p->pTrail == (lit *)0x0) {
      plVar3 = (lit *)malloc((long)iVar8 << 2);
    }
    else {
      plVar3 = (lit *)realloc(p->pTrail,(long)iVar8 << 2);
    }
    p->pTrail = plVar3;
    sVar9 = (long)p->nVarsAlloc << 2;
    if (p->pAssigns == (lit *)0x0) {
      plVar3 = (lit *)malloc(sVar9);
    }
    else {
      plVar3 = (lit *)realloc(p->pAssigns,sVar9);
    }
    p->pAssigns = plVar3;
    if (p->pSeens == (char *)0x0) {
      pcVar4 = (char *)malloc((long)p->nVarsAlloc);
    }
    else {
      pcVar4 = (char *)realloc(p->pSeens,(long)p->nVarsAlloc);
    }
    p->pSeens = pcVar4;
    sVar9 = (long)p->nVarsAlloc << 2;
    if (p->pVarTypes == (int *)0x0) {
      piVar5 = (int *)malloc(sVar9);
    }
    else {
      piVar5 = (int *)realloc(p->pVarTypes,sVar9);
    }
    p->pVarTypes = piVar5;
    sVar9 = (long)p->nVarsAlloc << 3;
    if (p->pReasons == (Sto_Cls_t **)0x0) {
      ppSVar6 = (Sto_Cls_t **)malloc(sVar9);
    }
    else {
      ppSVar6 = (Sto_Cls_t **)realloc(p->pReasons,sVar9);
    }
    p->pReasons = ppSVar6;
    sVar9 = (long)p->nVarsAlloc << 4;
    if (p->pWatches == (Sto_Cls_t **)0x0) {
      ppSVar6 = (Sto_Cls_t **)malloc(sVar9);
    }
    else {
      ppSVar6 = (Sto_Cls_t **)realloc(p->pWatches,sVar9);
    }
    p->pWatches = ppSVar6;
    iVar2 = p->pCnf->nVars;
  }
  memset(p->pAssigns,0xff,(long)iVar2 << 2);
  memset(p->pSeens,0,(long)p->pCnf->nVars);
  memset(p->pVarTypes,0,(long)p->pCnf->nVars << 2);
  memset(p->pReasons,0,(long)p->pCnf->nVars << 3);
  memset(p->pWatches,0,(long)p->pCnf->nVars << 4);
  iVar2 = Int_ManGlobalVars(p);
  p->nVarsAB = iVar2;
  iVar8 = 1 << ((char)iVar2 - 5U & 0x1f);
  if (iVar2 < 6) {
    iVar8 = 1;
  }
  p->nWords = iVar8;
  iVar8 = p->nClosAlloc;
  iVar2 = p->pCnf->nClauses;
  if (iVar8 < iVar2) {
    iVar1 = 1;
    if (iVar8 != 0) goto LAB_0045f6d0;
    while( true ) {
      iVar8 = iVar1;
      p->nClosAlloc = iVar8;
LAB_0045f6d0:
      if (iVar2 <= iVar8) break;
      iVar1 = iVar8 * 2;
    }
    if (p->pProofNums == (int *)0x0) {
      piVar5 = (int *)malloc((long)iVar8 << 2);
    }
    else {
      piVar5 = (int *)realloc(p->pProofNums,(long)iVar8 << 2);
      iVar2 = p->pCnf->nClauses;
    }
    p->pProofNums = piVar5;
  }
  else {
    piVar5 = p->pProofNums;
  }
  memset(piVar5,0,(long)iVar2 << 2);
  lVar10 = (long)p->pCnf->nClauses * (long)p->nWords;
  iVar8 = (int)lVar10;
  if (p->nIntersAlloc < iVar8) {
    p->nIntersAlloc = iVar8;
    sVar9 = lVar10 * 4;
    if (p->pInters == (uint *)0x0) {
      puVar7 = (uint *)malloc(sVar9);
    }
    else {
      puVar7 = (uint *)realloc(p->pInters,sVar9);
    }
    p->pInters = puVar7;
  }
  return;
}

Assistant:

void Int_ManResize( Int_Man_t * p )
{
    // check if resizing is needed
    if ( p->nVarsAlloc < p->pCnf->nVars )
    {
        // find the new size
        if ( p->nVarsAlloc == 0 )
            p->nVarsAlloc = 1;
        while ( p->nVarsAlloc < p->pCnf->nVars ) 
            p->nVarsAlloc *= 2;
        // resize the arrays
        p->pTrail    = ABC_REALLOC(lit,         p->pTrail,    p->nVarsAlloc );
        p->pAssigns  = ABC_REALLOC(lit,         p->pAssigns,  p->nVarsAlloc );
        p->pSeens    = ABC_REALLOC(char,        p->pSeens,    p->nVarsAlloc );
        p->pVarTypes = ABC_REALLOC(int,         p->pVarTypes, p->nVarsAlloc );
        p->pReasons  = ABC_REALLOC(Sto_Cls_t *, p->pReasons,  p->nVarsAlloc );
        p->pWatches  = ABC_REALLOC(Sto_Cls_t *, p->pWatches,  p->nVarsAlloc*2 );
    }

    // clean the free space
    memset( p->pAssigns , 0xff, sizeof(lit) * p->pCnf->nVars );
    memset( p->pSeens   , 0,    sizeof(char) * p->pCnf->nVars );
    memset( p->pVarTypes, 0,    sizeof(int) * p->pCnf->nVars );
    memset( p->pReasons , 0,    sizeof(Sto_Cls_t *) * p->pCnf->nVars );
    memset( p->pWatches , 0,    sizeof(Sto_Cls_t *) * p->pCnf->nVars*2 );

    // compute the number of common variables
    p->nVarsAB = Int_ManGlobalVars( p );
    // compute the number of words in the truth table
    p->nWords = (p->nVarsAB <= 5 ? 1 : (1 << (p->nVarsAB - 5)));

    // check if resizing of clauses is needed
    if ( p->nClosAlloc < p->pCnf->nClauses )
    {
        // find the new size
        if ( p->nClosAlloc == 0 )
            p->nClosAlloc = 1;
        while ( p->nClosAlloc < p->pCnf->nClauses ) 
            p->nClosAlloc *= 2;
        // resize the arrays
        p->pProofNums = ABC_REALLOC(int, p->pProofNums,  p->nClosAlloc );
    }
    memset( p->pProofNums, 0, sizeof(int) * p->pCnf->nClauses );

    // check if resizing of truth tables is needed
    if ( p->nIntersAlloc < p->nWords * p->pCnf->nClauses )
    {
        p->nIntersAlloc = p->nWords * p->pCnf->nClauses;
        p->pInters = ABC_REALLOC(unsigned, p->pInters, p->nIntersAlloc );
    }
//    memset( p->pInters, 0, sizeof(unsigned) * p->nWords * p->pCnf->nClauses );
}